

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateServiceDefinitions
          (FileGenerator *this,Printer *printer)

{
  long lVar1;
  ulong uVar2;
  
  if ((((0 < *(int *)(this->file_ + 0x78)) && ((this->options_).enforce_lite == false)) &&
      (lVar1 = *(long *)(this->file_ + 0xa0), *(int *)(lVar1 + 0xa8) != 3)) &&
     (*(char *)(lVar1 + 0xa3) == '\x01')) {
    if ((this->service_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->service_generators_).
        super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar2 = 0;
      do {
        if (uVar2 != 0) {
          io::Printer::Print(printer,"\n");
          io::Printer::Print(printer,
                             "// -------------------------------------------------------------------\n"
                            );
          io::Printer::Print(printer,"\n");
        }
        ServiceGenerator::GenerateDeclarations
                  ((this->service_generators_).
                   super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar2],printer);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)((long)(this->service_generators_).
                                     super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->service_generators_).
                                     super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    io::Printer::Print(printer,"\n");
    io::Printer::Print(printer,
                       "// ===================================================================\n");
    io::Printer::Print(printer,"\n");
    return;
  }
  return;
}

Assistant:

void FileGenerator::GenerateServiceDefinitions(io::Printer* printer) {
  if (HasGenericServices(file_, options_)) {
    // Generate service definitions.
    for (int i = 0; i < service_generators_.size(); i++) {
      if (i > 0) {
        printer->Print("\n");
        printer->Print(kThinSeparator);
        printer->Print("\n");
      }
      service_generators_[i]->GenerateDeclarations(printer);
    }

    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
  }
}